

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall Memory::Recycler::VerifyMarkStack(Recycler *this)

{
  code *pcVar1;
  undefined8 *puVar2;
  bool bVar3;
  undefined4 *puVar4;
  long lVar5;
  undefined8 *puVar6;
  undefined8 *local_38;
  ULONG_PTR highLimit;
  ULONG_PTR lowLimit;
  
  amd64_SAVE_REGISTERS(&this->savedThreadContext);
  puVar6 = (undefined8 *)(this->savedThreadContext).registers[0];
  local_38 = (undefined8 *)0x0;
  highLimit = 0;
  GetCurrentThreadStackLimits(&highLimit,(ULONG_PTR *)&local_38);
  puVar2 = local_38;
  if (local_38 <= puVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x2180,"(stackStart > stackTop)","stackStart > stackTop");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  for (; puVar6 < puVar2; puVar6 = puVar6 + 1) {
    VerifyMark(this,(void *)0x0,(void *)*puVar6);
  }
  lVar5 = 0x12f;
  do {
    VerifyMark(this,(void *)0x0,*(void **)(&this->Cookie + lVar5 * 2));
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x13f);
  return;
}

Assistant:

void
Recycler::VerifyMarkStack()
{
    SAVE_THREAD_CONTEXT();
    void ** stackTop = (void**) this->savedThreadContext.GetStackTop();

    void * stackStart = GetStackBase();
    Assert(stackStart > stackTop);

    for (;stackTop < stackStart; stackTop++)
    {
        void* candidate = *stackTop;
        VerifyMark(nullptr, candidate);
    }

    void** registers = this->savedThreadContext.GetRegisters();
    for (int i = 0; i < SavedRegisterState::NumRegistersToSave; i++)
    {
        VerifyMark(nullptr, registers[i]);
    }
}